

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O0

void haggle_till_done(artifact *art,object *obj)

{
  char *prop_name;
  char *prop_name_00;
  _Bool _Var1;
  _Bool _Var2;
  _Bool _Var3;
  uint32_t uVar4;
  int iVar5;
  uint32_t uVar6;
  wchar_t wVar7;
  obj_property *poVar8;
  int16_t *local_388;
  int16_t *local_380;
  int16_t *local_378;
  element_info *local_370;
  object_kind *local_60;
  int16_t *local_58;
  int16_t *bonus_chg;
  int16_t *res;
  char *sust;
  char *stat;
  wchar_t rounds;
  _Bool launcher;
  _Bool weapon;
  wchar_t limit;
  wchar_t choice;
  wchar_t bonus;
  wchar_t i;
  object_kind *kind;
  object *obj_local;
  artifact *art_local;
  
  if (art == (artifact *)0x0) {
    local_60 = lookup_kind((uint)obj->tval,(uint)obj->sval);
  }
  else {
    local_60 = lookup_kind(art->tval,art->sval);
  }
  rounds = L'\x14';
  _Var1 = tval_is_melee_weapon_k(local_60);
  _Var2 = tval_is_launcher_k(local_60);
  uVar4 = Rand_div(6);
  if ((uVar4 == 0) && (L'ᆓ' < potential)) {
    get_property(art,obj,"strength",L'\x01',true);
    get_property(art,obj,"wisdom",L'\x01',true);
    get_property(art,obj,"intelligence",L'\x01',true);
    get_property(art,obj,"dexterity",L'\x01',true);
    get_property(art,obj,"constitution",L'\x01',true);
  }
  else {
    uVar4 = Rand_div(3);
    if ((uVar4 != 0) && (L'˭' < potential)) {
      uVar4 = Rand_div(2);
      iVar5 = potential / 2000;
      uVar6 = Rand_div(2);
      wVar7 = iVar5 + uVar6 + 1;
      for (choice = L'\0'; choice < uVar4 + L'\x01'; choice = choice + L'\x01') {
        if (_Var1) {
          uVar6 = Rand_div(10);
        }
        else {
          uVar6 = Rand_div(9);
        }
        switch(uVar6) {
        case 0:
          get_property(art,obj,"strength",wVar7,true);
          break;
        case 1:
          get_property(art,obj,"wisdom",wVar7,true);
          break;
        case 2:
          get_property(art,obj,"intelligence",wVar7,true);
          break;
        case 3:
          get_property(art,obj,"dexterity",wVar7,true);
          break;
        case 4:
          get_property(art,obj,"constitution",wVar7,true);
          break;
        case 5:
          get_property(art,obj,"infravision",wVar7,true);
          break;
        case 6:
          get_property(art,obj,"stealth",wVar7,true);
          break;
        case 7:
          get_property(art,obj,"searching skill",wVar7,true);
          break;
        case 8:
          get_property(art,obj,"speed",wVar7,true);
          break;
        case 9:
          get_property(art,obj,"tunneling",wVar7,true);
        }
      }
    }
  }
  uVar4 = Rand_div(8);
  if (uVar4 == 0) {
    uVar4 = Rand_div(0xd);
    if ((uVar4 == 0) && (_Var3 = has_property(art,obj,"acid resistance"), !_Var3)) {
      uVar6 = Rand_div(6);
      get_property(art,obj,"acid resistance",(uVar6 + 1) * -5,true);
    }
    if ((uVar4 == 1) && (_Var3 = has_property(art,obj,"electricity resistance"), !_Var3)) {
      uVar6 = Rand_div(6);
      get_property(art,obj,"electricity resistance",(uVar6 + 1) * -5,true);
    }
    if ((uVar4 == 2) && (_Var3 = has_property(art,obj,"fire resistance"), !_Var3)) {
      uVar6 = Rand_div(6);
      get_property(art,obj,"fire resistance",(uVar6 + 1) * -5,true);
    }
    if ((uVar4 == 3) && (_Var3 = has_property(art,obj,"cold resistance"), !_Var3)) {
      uVar6 = Rand_div(6);
      get_property(art,obj,"cold resistance",(uVar6 + 1) * -5,true);
    }
    if ((uVar4 == 4) && (_Var3 = has_property(art,obj,"poison resistance"), !_Var3)) {
      uVar6 = Rand_div(6);
      get_property(art,obj,"poison resistance",(uVar6 + 1) * -5,true);
    }
    if ((uVar4 == 5) && (_Var3 = has_property(art,obj,"light resistance"), !_Var3)) {
      uVar6 = Rand_div(6);
      get_property(art,obj,"light resistance",(uVar6 + 1) * -5,true);
    }
    if ((uVar4 == 6) && (_Var3 = has_property(art,obj,"dark resistance"), !_Var3)) {
      uVar6 = Rand_div(6);
      get_property(art,obj,"dark resistance",(uVar6 + 1) * -5,true);
    }
    if ((uVar4 == 7) && (_Var3 = has_property(art,obj,"sound resistance"), !_Var3)) {
      uVar6 = Rand_div(6);
      get_property(art,obj,"sound resistance",(uVar6 + 1) * -5,true);
    }
    if ((uVar4 == 8) && (_Var3 = has_property(art,obj,"shards resistance"), !_Var3)) {
      uVar6 = Rand_div(6);
      get_property(art,obj,"shards resistance",(uVar6 + 1) * -5,true);
    }
    if ((uVar4 == 9) && (_Var3 = has_property(art,obj,"nexus resistance"), !_Var3)) {
      uVar6 = Rand_div(6);
      get_property(art,obj,"nexus resistance",(uVar6 + 1) * -5,true);
    }
    if ((uVar4 == 10) && (_Var3 = has_property(art,obj,"nether resistance"), !_Var3)) {
      uVar6 = Rand_div(6);
      get_property(art,obj,"nether resistance",(uVar6 + 1) * -5,true);
    }
    if ((uVar4 == 0xb) && (_Var3 = has_property(art,obj,"chaos resistance"), !_Var3)) {
      uVar6 = Rand_div(6);
      get_property(art,obj,"chaos resistance",(uVar6 + 1) * -5,true);
    }
    if ((uVar4 == 0xc) && (_Var3 = has_property(art,obj,"disenchantment resistance"), !_Var3)) {
      uVar4 = Rand_div(6);
      get_property(art,obj,"disenchantment resistance",(uVar4 + 1) * -5,true);
    }
  }
  if ((L'ߐ' < potential) && (uVar4 = Rand_div(3), uVar4 != 0)) {
    uVar4 = Rand_div(5);
    if ((uVar4 == 0) && (_Var3 = has_property(art,obj,"telepathy"), !_Var3)) {
      get_property(art,obj,"telepathy",L'\0',true);
    }
    if ((uVar4 == 1) && (_Var3 = has_property(art,obj,"hold life"), !_Var3)) {
      get_property(art,obj,"hold life",L'\0',true);
    }
    if (uVar4 == 2) {
      _Var3 = has_property(art,obj,"protection from confusion");
      if (!_Var3) {
        get_property(art,obj,"protection from confusion",L'\0',true);
      }
      _Var3 = has_property(art,obj,"protection from blindness");
      if (!_Var3) {
        get_property(art,obj,"protection from blindness",L'\0',true);
      }
    }
    if (uVar4 == 3) {
      uVar6 = Rand_div(4);
      if ((uVar6 != 0) || (_Var3 = has_property(art,obj,"disenchantment resistance"), _Var3)) {
        uVar6 = Rand_div(3);
        if ((uVar6 != 0) || (_Var3 = has_property(art,obj,"nether resistance"), _Var3)) {
          uVar6 = Rand_div(2);
          if ((uVar6 != 0) || (_Var3 = has_property(art,obj,"chaos resistance"), _Var3)) {
            _Var3 = has_property(art,obj,"poison resistance");
            if (!_Var3) {
              get_property(art,obj,"poison resistance",L'\0',true);
            }
          }
          else {
            get_property(art,obj,"chaos resistance",L'\0',true);
          }
        }
        else {
          get_property(art,obj,"nether resistance",L'\0',true);
        }
      }
      else {
        get_property(art,obj,"disenchantment resistance",L'\0',true);
      }
    }
    if ((uVar4 == 4) && (L'ᆔ' < potential)) {
      uVar4 = Rand_div(2);
      if ((uVar4 != 0) || (_Var3 = has_property(art,obj,"speed"), _Var3)) {
        get_property(art,obj,"sustain strength",L'\0',true);
        get_property(art,obj,"sustain wisdom",L'\0',true);
        get_property(art,obj,"sustain intelligence",L'\0',true);
        get_property(art,obj,"sustain dexterity",L'\0',true);
        get_property(art,obj,"sustain constitution",L'\0',true);
      }
      else {
        uVar4 = Rand_div(10);
        get_property(art,obj,"speed",uVar4 + L'\x01',true);
      }
    }
  }
  uVar4 = Rand_div(5);
  if (((int)(uVar4 + 1) < 3) || (L'ઽ' < potential)) {
    uVar4 = Rand_div(3);
    wVar7 = uVar4 + L'\x01';
    if (_Var1) {
      uVar4 = Rand_div(9);
    }
    else {
      uVar4 = Rand_div(8);
    }
    if (uVar4 == 0) {
      get_property(art,obj,"strength",wVar7,true);
    }
    if (uVar4 == 1) {
      get_property(art,obj,"wisdom",wVar7,true);
    }
    if (uVar4 == 2) {
      get_property(art,obj,"intelligence",wVar7,true);
    }
    if (uVar4 == 3) {
      get_property(art,obj,"dexterity",wVar7,true);
    }
    if (uVar4 == 4) {
      get_property(art,obj,"constitution",wVar7,true);
    }
    if (uVar4 == 5) {
      get_property(art,obj,"stealth",wVar7,true);
    }
    if (uVar4 == 6) {
      get_property(art,obj,"searching skill",wVar7,true);
    }
    if (uVar4 == 7) {
      get_property(art,obj,"speed",wVar7,true);
    }
    if (uVar4 == 8) {
      get_property(art,obj,"tunneling",wVar7,true);
    }
  }
  do {
    wVar7 = rounds;
    if (L'ī' < potential) {
      rounds = rounds + L'\xffffffff';
    }
    if (L'ī' >= potential || wVar7 < L'\x01') goto LAB_001c0c96;
    if (_Var1) {
      if (art == (artifact *)0x0) {
        __assert_fail("art",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-design.c"
                      ,0xb53,"void haggle_till_done(struct artifact *, struct object *)");
      }
      _Var3 = flag_has_dbg(art->flags,6,0x29,"art->flags","OF_THROWING");
      if ((_Var3) && (uVar4 = Rand_div(2), uVar4 == 0)) {
        get_property(art,obj,"perfect balance",L'\0',true);
      }
      _Var3 = has_property(art,obj,"enhanced dice");
      if (_Var3) {
        uVar4 = Rand_div(3);
        if ((uVar4 == 0) && (L'כ' < potential)) {
          if (art->weight == local_60->weight) {
            uVar4 = Rand_div(3);
            if (uVar4 == 0) {
              uVar4 = Rand_div(art->weight / 10);
              art->weight = (uVar4 + 1) * 5 + 5 + art->weight;
              potential = (art->weight - local_60->weight) * 10 + potential;
            }
            else {
              uVar4 = Rand_div(2);
              if ((uVar4 == 0) && (0x95 < art->weight)) {
                uVar4 = Rand_div(art->weight / 10);
                art->weight = art->weight - ((uVar4 + 1) * 5 + 5);
                potential = potential + (local_60->weight - art->weight) * -10;
              }
            }
          }
          uVar4 = Rand_div(3);
          if ((uVar4 == 0) && (initial_potential < L'ྡ')) {
            uVar4 = Rand_div(3);
            if (uVar4 != 0) {
              art->to_h = 0;
              potential = potential + L'ɘ';
              uVar4 = Rand_div(4);
              if (uVar4 == 0) {
                art->to_h = 0;
                potential = potential + L'ɘ';
              }
            }
            get_property(art,obj,"enhanced dice",L'\x01',true);
LAB_001c0c96:
            wVar7 = Rand_div(5);
            for (choice = L'\0'; choice < L'\x05'; choice = choice + L'\x01') {
              poVar8 = lookup_obj_property(L'\x01',choice);
              prop_name = poVar8->name;
              poVar8 = lookup_obj_property(L'\x03',choice + L'\x01');
              prop_name_00 = poVar8->name;
              if ((wVar7 == choice) && (_Var2 = has_property(art,obj,prop_name), _Var2)) {
                get_property(art,obj,prop_name_00,L'\0',true);
              }
            }
            if (((_Var1) && (uVar4 = Rand_div(4), uVar4 == 0)) || (uVar4 = Rand_div(2), uVar4 == 0))
            {
              uVar4 = Rand_div(6);
              if (art == (artifact *)0x0) {
                local_370 = obj->el_info + (int)uVar4;
              }
              else {
                local_370 = art->el_info + (int)uVar4;
              }
              if ((int)uVar4 < 4) {
                local_370->res_level = (int16_t)((long)((int)local_370->res_level << 1) / 3);
              }
              else if (uVar4 == 4) {
                get_property(art,obj,"slow digestion",L'\0',true);
              }
              else if (uVar4 == 5) {
                get_property(art,obj,"feather falling",L'\0',true);
              }
            }
            for (choice = L'\0'; choice < L'\x03'; choice = choice + L'\x01') {
              if (art == (artifact *)0x0) {
                local_378 = &obj->to_a;
              }
              else {
                local_378 = &art->to_a;
              }
              local_58 = local_378;
              if (choice == L'\x01') {
                if (art == (artifact *)0x0) {
                  local_380 = &obj->to_h;
                }
                else {
                  local_380 = &art->to_h;
                }
                local_58 = local_380;
              }
              if (choice == L'\x02') {
                if (art == (artifact *)0x0) {
                  local_388 = &obj->to_d;
                }
                else {
                  local_388 = &art->to_d;
                }
                local_58 = local_388;
              }
              if (((int)*local_58 % 5 == 4) && (uVar4 = Rand_div(2), uVar4 == 0)) {
                *local_58 = *local_58 + 1;
              }
              else if (((int)*local_58 % 5 == 1) && (uVar4 = Rand_div(2), uVar4 == 0)) {
                *local_58 = *local_58 + -1;
              }
              else if (((int)*local_58 % 2 == 1) && (uVar4 = Rand_div(4), uVar4 != 0)) {
                *local_58 = *local_58 + 1;
              }
            }
            return;
          }
        }
      }
      else {
        uVar4 = Rand_div((uint)art->dd * (uint)art->ds);
        if (((int)(uVar4 + 1) < 5) || (L'࠳' < potential)) {
          get_property(art,obj,"enhanced dice",L'\x03',true);
        }
      }
      uVar4 = Rand_div(0xd);
      if ((uVar4 == 0) && (_Var3 = has_property(art,obj,"slay animals"), !_Var3)) {
        get_property(art,obj,"slay animals",L'\x11',true);
      }
      if ((uVar4 == 1) && (_Var3 = has_property(art,obj,"slay evil creatures"), !_Var3)) {
        get_property(art,obj,"slay evil creatures",L'\x0f',true);
      }
      if ((uVar4 == 2) && (_Var3 = has_property(art,obj,"slay undead"), !_Var3)) {
        get_property(art,obj,"slay undead",L'\x14',true);
      }
      if ((uVar4 == 3) && (_Var3 = has_property(art,obj,"slay demons"), !_Var3)) {
        get_property(art,obj,"slay demons",L'\x14',true);
      }
      if ((uVar4 == 4) && (_Var3 = has_property(art,obj,"slay orcs"), !_Var3)) {
        get_property(art,obj,"slay orcs",L'\x14',true);
      }
      if ((uVar4 == 5) && (_Var3 = has_property(art,obj,"slay trolls"), !_Var3)) {
        get_property(art,obj,"slay trolls",L'\x14',true);
      }
      if ((uVar4 == 6) && (_Var3 = has_property(art,obj,"slay giants"), !_Var3)) {
        get_property(art,obj,"slay giants",L'\x14',true);
      }
      if ((uVar4 == 7) && (_Var3 = has_property(art,obj,"slay dragons"), !_Var3)) {
        get_property(art,obj,"slay dragons",L'\x14',true);
      }
      if ((uVar4 == 8) && (_Var3 = has_property(art,obj,"acid brand"), !_Var3)) {
        get_property(art,obj,"acid brand",L'\x11',true);
      }
      if ((uVar4 == 9) && (_Var3 = has_property(art,obj,"lightning brand"), !_Var3)) {
        get_property(art,obj,"lightning brand",L'\x11',true);
      }
      if ((uVar4 == 10) && (_Var3 = has_property(art,obj,"fire brand"), !_Var3)) {
        get_property(art,obj,"fire brand",L'\x11',true);
      }
      if ((uVar4 == 0xb) && (_Var3 = has_property(art,obj,"cold brand"), !_Var3)) {
        get_property(art,obj,"cold brand",L'\x11',true);
      }
      if ((uVar4 == 0xc) && (_Var3 = has_property(art,obj,"poison brand"), !_Var3)) {
        get_property(art,obj,"poison brand",L'\x11',true);
      }
      uVar4 = Rand_div(2);
      if (uVar4 == 0) {
        uVar4 = Rand_div(8);
        if ((uVar4 == 0) && (_Var3 = has_property(art,obj,"slow digestion"), !_Var3)) {
          get_property(art,obj,"slow digestion",L'\0',false);
        }
        if ((uVar4 == 1) && (_Var3 = has_property(art,obj,"feather falling"), !_Var3)) {
          get_property(art,obj,"feather falling",L'\0',false);
        }
        if ((uVar4 == 2) && (_Var3 = has_property(art,obj,"light"), !_Var3)) {
          get_property(art,obj,"light",L'\x01',false);
        }
        if ((uVar4 == 3) && (_Var3 = has_property(art,obj,"regeneration"), !_Var3)) {
          get_property(art,obj,"regeneration",L'\0',false);
        }
        if ((uVar4 == 4) && (_Var3 = has_property(art,obj,"see invisible"), !_Var3)) {
          get_property(art,obj,"see invisible",L'\0',false);
        }
        if ((uVar4 == 5) && (_Var3 = has_property(art,obj,"free action"), !_Var3)) {
          get_property(art,obj,"free action",L'\0',false);
        }
        if ((uVar4 == 6) && (_Var3 = has_property(art,obj,"protection from fear"), !_Var3)) {
          get_property(art,obj,"protection from fear",L'\0',false);
        }
        if ((uVar4 == 7) && (_Var3 = has_property(art,obj,"protection from blindness"), !_Var3)) {
          get_property(art,obj,"protection from blindness",L'\0',false);
        }
      }
      uVar4 = Rand_div(3);
      if (uVar4 == 0) {
        uVar4 = Rand_div(0xb);
        if ((uVar4 == 0) && (_Var3 = has_property(art,obj,"acid resistance"), !_Var3)) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"acid resistance",uVar6 * 5 + L'#',true);
        }
        if ((uVar4 == 1) && (_Var3 = has_property(art,obj,"electricity resistance"), !_Var3)) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"electricity resistance",uVar6 * 5 + L'#',true);
        }
        if ((uVar4 == 2) && (_Var3 = has_property(art,obj,"fire resistance"), !_Var3)) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"fire resistance",uVar6 * 5 + L'#',true);
        }
        if ((uVar4 == 3) && (_Var3 = has_property(art,obj,"cold resistance"), !_Var3)) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"cold resistance",uVar6 * 5 + L'#',true);
        }
        if ((uVar4 == 4) && (_Var3 = has_property(art,obj,"poison resistance"), !_Var3)) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"poison resistance",uVar6 * 5 + L'#',true);
        }
        if ((uVar4 == 5) && (_Var3 = has_property(art,obj,"light resistance"), !_Var3)) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"light resistance",uVar6 * 5 + L'#',true);
        }
        if ((uVar4 == 6) && (_Var3 = has_property(art,obj,"dark resistance"), !_Var3)) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"dark resistance",uVar6 * 5 + L'#',true);
        }
        if ((uVar4 == 7) && (_Var3 = has_property(art,obj,"sound resistance"), !_Var3)) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"sound resistance",uVar6 * 5 + L'#',true);
        }
        if ((uVar4 == 8) && (_Var3 = has_property(art,obj,"shards resistance"), !_Var3)) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"shards resistance",uVar6 * 5 + L'#',true);
        }
        if ((uVar4 == 9) && (_Var3 = has_property(art,obj,"nexus resistance"), !_Var3)) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"nexus resistance",uVar6 * 5 + L'#',true);
        }
        if ((uVar4 == 10) && (_Var3 = has_property(art,obj,"disenchantment resistance"), !_Var3)) {
          uVar4 = Rand_div(5);
          get_property(art,obj,"disenchantment resistance",uVar4 * 5 + L'#',true);
        }
      }
      if ((potential < L'Ǵ') && (uVar4 = Rand_div(5), uVar4 == 0)) {
        _Var3 = has_property(art,obj,"deadliness bonus");
        if (_Var3) {
          get_property(art,obj,"deadliness bonus",potential / 0x96,true);
        }
        _Var3 = has_property(art,obj,"skill bonus");
        if (_Var3) {
          get_property(art,obj,"skill bonus",potential / 0x96,true);
        }
        potential = L'\0';
      }
    }
    if (_Var2) {
      uVar4 = Rand_div(8);
      if ((uVar4 == 0) && (_Var3 = has_property(art,obj,"slow digestion"), !_Var3)) {
        get_property(art,obj,"slow digestion",L'\0',false);
      }
      if ((uVar4 == 1) && (_Var3 = has_property(art,obj,"feather falling"), !_Var3)) {
        get_property(art,obj,"feather falling",L'\0',false);
      }
      if ((uVar4 == 2) && (_Var3 = has_property(art,obj,"light"), !_Var3)) {
        get_property(art,obj,"light",L'\x01',false);
      }
      if ((uVar4 == 3) && (_Var3 = has_property(art,obj,"regeneration"), !_Var3)) {
        get_property(art,obj,"regeneration",L'\0',false);
      }
      if ((uVar4 == 4) && (_Var3 = has_property(art,obj,"see invisible"), !_Var3)) {
        get_property(art,obj,"see invisible",L'\0',false);
      }
      if ((uVar4 == 5) && (_Var3 = has_property(art,obj,"free action"), !_Var3)) {
        get_property(art,obj,"free action",L'\0',false);
      }
      if ((uVar4 == 6) && (_Var3 = has_property(art,obj,"protection from fear"), !_Var3)) {
        get_property(art,obj,"protection from fear",L'\0',false);
      }
      if ((uVar4 == 7) && (_Var3 = has_property(art,obj,"protection from blindness"), !_Var3)) {
        get_property(art,obj,"protection from blindness",L'\0',false);
      }
      uVar4 = Rand_div(2);
      if (uVar4 == 0) {
        uVar4 = Rand_div(0xb);
        if ((uVar4 == 0) && (_Var3 = has_property(art,obj,"acid resistance"), !_Var3)) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"acid resistance",uVar6 * 5 + L'#',true);
        }
        if ((uVar4 == 1) && (_Var3 = has_property(art,obj,"electricity resistance"), !_Var3)) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"electricity resistance",uVar6 * 5 + L'#',true);
        }
        if ((uVar4 == 2) && (_Var3 = has_property(art,obj,"fire resistance"), !_Var3)) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"fire resistance",uVar6 * 5 + L'#',true);
        }
        if ((uVar4 == 3) && (_Var3 = has_property(art,obj,"cold resistance"), !_Var3)) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"cold resistance",uVar6 * 5 + L'#',true);
        }
        if ((uVar4 == 4) && (_Var3 = has_property(art,obj,"poison resistance"), !_Var3)) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"poison resistance",uVar6 * 5 + L'#',true);
        }
        if ((uVar4 == 5) && (_Var3 = has_property(art,obj,"light resistance"), !_Var3)) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"light resistance",uVar6 * 5 + L'#',true);
        }
        if ((uVar4 == 6) && (_Var3 = has_property(art,obj,"dark resistance"), !_Var3)) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"dark resistance",uVar6 * 5 + L'#',true);
        }
        if ((uVar4 == 7) && (_Var3 = has_property(art,obj,"sound resistance"), !_Var3)) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"sound resistance",uVar6 * 5 + L'#',true);
        }
        if ((uVar4 == 8) && (_Var3 = has_property(art,obj,"shards resistance"), !_Var3)) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"shards resistance",uVar6 * 5 + L'#',true);
        }
        if ((uVar4 == 9) && (_Var3 = has_property(art,obj,"nexus resistance"), !_Var3)) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"nexus resistance",uVar6 * 5 + L'#',true);
        }
        if ((uVar4 == 10) && (_Var3 = has_property(art,obj,"disenchantment resistance"), !_Var3)) {
          uVar4 = Rand_div(5);
          get_property(art,obj,"disenchantment resistance",uVar4 * 5 + L'#',true);
        }
      }
      if ((potential < L'Ǵ') && (uVar4 = Rand_div(5), uVar4 == 0)) {
        _Var3 = has_property(art,obj,"deadliness bonus");
        if (_Var3) {
          get_property(art,obj,"deadliness bonus",potential / 0x96,true);
        }
        _Var3 = has_property(art,obj,"skill bonus");
        if (_Var3) {
          get_property(art,obj,"skill bonus",potential / 0x96,true);
        }
        potential = L'\0';
      }
    }
    uVar4 = Rand_div(0xb);
    if ((uVar4 == 0) && (_Var3 = has_property(art,obj,"acid resistance"), !_Var3)) {
      uVar6 = Rand_div(5);
      get_property(art,obj,"acid resistance",uVar6 * 5 + L'#',true);
    }
    if ((uVar4 == 1) && (_Var3 = has_property(art,obj,"electricity resistance"), !_Var3)) {
      uVar6 = Rand_div(5);
      get_property(art,obj,"electricity resistance",uVar6 * 5 + L'#',true);
    }
    if ((uVar4 == 2) && (_Var3 = has_property(art,obj,"fire resistance"), !_Var3)) {
      uVar6 = Rand_div(5);
      get_property(art,obj,"fire resistance",uVar6 * 5 + L'#',true);
    }
    if ((uVar4 == 3) && (_Var3 = has_property(art,obj,"cold resistance"), !_Var3)) {
      uVar6 = Rand_div(5);
      get_property(art,obj,"cold resistance",uVar6 * 5 + L'#',true);
    }
    if ((uVar4 == 4) && (_Var3 = has_property(art,obj,"poison resistance"), !_Var3)) {
      uVar6 = Rand_div(5);
      get_property(art,obj,"poison resistance",uVar6 * 5 + L'#',true);
    }
    if ((uVar4 == 5) && (_Var3 = has_property(art,obj,"light resistance"), !_Var3)) {
      uVar6 = Rand_div(5);
      get_property(art,obj,"light resistance",uVar6 * 5 + L'#',true);
    }
    if ((uVar4 == 6) && (_Var3 = has_property(art,obj,"dark resistance"), !_Var3)) {
      uVar6 = Rand_div(5);
      get_property(art,obj,"dark resistance",uVar6 * 5 + L'#',true);
    }
    if ((uVar4 == 7) && (_Var3 = has_property(art,obj,"sound resistance"), !_Var3)) {
      uVar6 = Rand_div(5);
      get_property(art,obj,"sound resistance",uVar6 * 5 + L'#',true);
    }
    if ((uVar4 == 8) && (_Var3 = has_property(art,obj,"shards resistance"), !_Var3)) {
      uVar6 = Rand_div(5);
      get_property(art,obj,"shards resistance",uVar6 * 5 + L'#',true);
    }
    if ((uVar4 == 9) && (_Var3 = has_property(art,obj,"nexus resistance"), !_Var3)) {
      uVar6 = Rand_div(5);
      get_property(art,obj,"nexus resistance",uVar6 * 5 + L'#',true);
    }
    if ((uVar4 == 10) && (_Var3 = has_property(art,obj,"disenchantment resistance"), !_Var3)) {
      uVar4 = Rand_div(5);
      get_property(art,obj,"disenchantment resistance",uVar4 * 5 + L'#',true);
    }
    uVar4 = Rand_div(3);
    if (uVar4 == 0) {
      uVar4 = Rand_div(8);
      if ((uVar4 == 0) && (_Var3 = has_property(art,obj,"slow digestion"), !_Var3)) {
        get_property(art,obj,"slow digestion",L'\0',false);
      }
      if ((uVar4 == 1) && (_Var3 = has_property(art,obj,"feather falling"), !_Var3)) {
        get_property(art,obj,"feather falling",L'\0',false);
      }
      if ((uVar4 == 2) && (_Var3 = has_property(art,obj,"light"), !_Var3)) {
        get_property(art,obj,"light",L'\x01',false);
      }
      if ((uVar4 == 3) && (_Var3 = has_property(art,obj,"regeneration"), !_Var3)) {
        get_property(art,obj,"regeneration",L'\0',false);
      }
      if ((uVar4 == 4) && (_Var3 = has_property(art,obj,"see invisible"), !_Var3)) {
        get_property(art,obj,"see invisible",L'\0',false);
      }
      if ((uVar4 == 5) && (_Var3 = has_property(art,obj,"free action"), !_Var3)) {
        get_property(art,obj,"free action",L'\0',false);
      }
      if ((uVar4 == 6) && (_Var3 = has_property(art,obj,"protection from fear"), !_Var3)) {
        get_property(art,obj,"protection from fear",L'\0',false);
      }
      if ((uVar4 == 7) && (_Var3 = has_property(art,obj,"protection from blindness"), !_Var3)) {
        get_property(art,obj,"protection from blindness",L'\0',false);
      }
      if (((potential < L'Ǵ') && (uVar4 = Rand_div(5), uVar4 == 0)) &&
         (_Var3 = has_property(art,obj,"armor bonus"), _Var3)) {
        get_property(art,obj,"armor bonus",potential / 100,true);
        potential = L'\0';
      }
    }
  } while( true );
}

Assistant:

static void haggle_till_done(struct artifact *art, struct object *obj)
{
	struct object_kind *kind = art ? lookup_kind(art->tval, art->sval) :
		lookup_kind(obj->tval, obj->sval);
	int i;
	int bonus = 0;
	int choice = 0;
	int limit = 20;
	bool weapon = tval_is_melee_weapon_k(kind);
	bool launcher = tval_is_launcher_k(kind);

	/* Initial bonuses */
	if ((one_in_(6)) && (potential >= 4500)) {
		/* Rarely, and only if the artifact has a lot of potential, add all the
		 * stats. */
		get_property(art, obj, "strength", 1, true);
		get_property(art, obj, "wisdom", 1, true);
		get_property(art, obj, "intelligence", 1, true);
		get_property(art, obj, "dexterity", 1, true);
		get_property(art, obj, "constitution", 1, true);
	} else if (!one_in_(3) && (potential >= 750)) {
		/* Otherwise, if at least some potential remains, add a numerical bonus
		 * quality or two with 67% probability. */
		int rounds = randint1(2);
		bonus = potential / 2000 + randint1(2);

		for (i = 0; i < rounds; i++) {
			/* Only melee weapons can get a bonus to tunnelling. */
			if (weapon) {
				choice = randint1(10);
			} else {
				choice = randint1(9);
			}
			switch (choice) {
				case 1: get_property(art, obj, "strength", bonus, true); break;
				case 2: get_property(art, obj, "wisdom", bonus, true); break;
				case 3: get_property(art, obj, "intelligence", bonus, true);
					break;
				case 4: get_property(art, obj, "dexterity", bonus, true);
					break;
				case 5: get_property(art, obj, "constitution", bonus, true);
					break;
				case 6: get_property(art, obj, "infravision", bonus, true);
					break;
				case 7: get_property(art, obj, "stealth", bonus, true); break;
				case 8: get_property(art, obj, "searching skill", bonus, true);
					break;
				case 9: get_property(art, obj, "speed", bonus, true); break;
				case 10: get_property(art, obj, "tunneling", bonus, true);
					break;
				default: break;
			}
		}
	}

	/* Sometimes, collect a vulnerability in exchange for more potential */
	if (one_in_(8)) {
		choice = randint1(13);
		if ((choice == 1) && !has_property(art, obj, "acid resistance")) {
			get_property(art, obj, "acid resistance", -5 * randint1(6), true);
		}
		if ((choice == 2) && !has_property(art, obj, "electricity resistance")){
			get_property(art, obj, "electricity resistance", -5 * randint1(6),
						 true);
		}
		if ((choice == 3) && !has_property(art, obj, "fire resistance")) {
			get_property(art, obj, "fire resistance", -5 * randint1(6), true);
		}
		if ((choice == 4) && !has_property(art, obj, "cold resistance")) {
			get_property(art, obj, "cold resistance", -5 * randint1(6), true);
		}
		if ((choice == 5) && !has_property(art, obj, "poison resistance")) {
			get_property(art, obj, "poison resistance", -5 * randint1(6), true);
		}
		if ((choice == 6) && !has_property(art, obj, "light resistance")) {
			get_property(art, obj, "light resistance", -5 * randint1(6), true);
		}
		if ((choice == 7) && !has_property(art, obj, "dark resistance")) {
			get_property(art, obj, "dark resistance", -5 * randint1(6), true);
		}
		if ((choice == 8) && !has_property(art, obj, "sound resistance")) {
			get_property(art, obj, "sound resistance", -5 * randint1(6), true);
		}
		if ((choice == 9) && !has_property(art, obj, "shards resistance")) {
			get_property(art, obj, "shards resistance", -5 * randint1(6), true);
		}
		if ((choice == 10) && !has_property(art, obj, "nexus resistance")) {
			get_property(art, obj, "nexus resistance", -5 * randint1(6), true);
		}
		if ((choice == 11) && !has_property(art, obj, "nether resistance")) {
			get_property(art, obj, "nether resistance", -5 * randint1(6), true);
		}
		if ((choice == 12) && !has_property(art, obj, "chaos resistance")) {
			get_property(art, obj, "chaos resistance", -5 * randint1(6), true);
		}
		if ((choice == 13) && !has_property(art, obj,
											"disenchantment resistance")) {
			get_property(art, obj, "disenchantment resistance",
						 -5 * randint1(6), true);
		}
	}

	/* Artifacts that still have lots of money to spend deserve the best. */
	if ((potential > 2000) && !one_in_(3)) {

		/* Make a choice... */
		choice = randint1(5);
		/* ...among some tasty options. */
		if ((choice == 1) && !has_property(art, obj, "telepathy")) {
			get_property(art, obj, "telepathy", 0, true);
		}
		if ((choice == 2) && !has_property(art, obj, "hold life")) {
			get_property(art, obj, "hold life", 0, true);
		}
		if (choice == 3) {
			if (!has_property(art, obj, "protection from confusion")) {
				get_property(art, obj, "protection from confusion", 0, true);
			}
			if (!has_property(art, obj, "protection from blindness")) {
				get_property(art, obj, "protection from blindness", 0, true);
			}
		}
		if (choice == 4) {
			if (one_in_(4) && !has_property(art, obj,
											"disenchantment resistance")) {
				get_property(art, obj, "disenchantment resistance", 0, true);
			} else if (one_in_(3) && !has_property(art, obj,
												   "nether resistance")) {
				get_property(art, obj, "nether resistance", 0, true);
			} else if (one_in_(2) && !has_property(art, obj,
												   "chaos resistance")) {
				get_property(art, obj, "chaos resistance", 0, true);
			} else if (!has_property(art, obj, "poison resistance")) {
				get_property(art, obj, "poison resistance", 0, true);
			}
		}
		if ((choice == 5) && (potential > 4500)) {
			if (one_in_(2) && !has_property(art, obj, "speed")) {
				get_property(art, obj, "speed", randint1(10), true);
			}

			else {
				get_property(art, obj, "sustain strength", 0, true);
				get_property(art, obj, "sustain wisdom", 0, true);
				get_property(art, obj, "sustain intelligence", 0, true);
				get_property(art, obj, "sustain dexterity", 0, true);
				get_property(art, obj, "sustain constitution", 0, true);
			}
		}
	}

	/* Sometimes, also add a new numerical bonus quality. Infravision and
	 * magical item mastery are not on offer. Only melee weapons can get a
	 * bonus to tunnelling. */
	if ((randint1(5) < 3) || (potential >= 2750)) {
		bonus = randint1(3);
		if (weapon) {
			choice = randint1(9);
		} else {
			choice = randint1(8);
		}
		if (choice == 1) {
			get_property(art, obj, "strength", bonus, true);
		}
		if (choice == 2) {
			get_property(art, obj, "wisdom", bonus, true);
		}
		if (choice == 3) {
			get_property(art, obj, "intelligence", bonus, true);
		}
		if (choice == 4) {
			get_property(art, obj, "dexterity", bonus, true);
		}
		if (choice == 5) {
			get_property(art, obj, "constitution", bonus, true);
		}
		if (choice == 6) {
			get_property(art, obj, "stealth", bonus, true);
		}
		if (choice == 7) {
			get_property(art, obj, "searching skill", bonus, true);
		}
		if (choice == 8) {
			get_property(art, obj, "speed", bonus, true);
		}
		if (choice == 9) {
			get_property(art, obj, "tunneling", bonus, true);
		}
	}

	/* Now, we enter Filene's Basement, and shop 'til we drop! (well, nearly) */
	while ((potential >= 300) && (limit-- > 0)) {

		/* I'm a melee weapon. */
		if (weapon) {
			/* Should be an artifact */
			assert(art);

			/* Some throwing weapons can be thrown hard and fast. */
			if (of_has(art->flags, OF_THROWING) && one_in_(2))
				get_property(art, obj, "perfect balance", 0, true);
			/* Some weapons already will have superb base damage. */
			if (has_property(art, obj, "enhanced dice")) {

				/* Sometimes, such weapons are unusual. */
				if (one_in_(3) && (potential >= 1500)) {
					if (art->weight == kind->weight) {
						if (one_in_(3)) {
							/* Sometimes, such weapons are unusually heavy. */
							art->weight += randint1(art->weight / 10) * 5 + 5;
							potential += (art->weight - kind->weight) * 10;
						} else if (one_in_(2) && (art->weight >= 150)) {
							/* Sometimes, such weapons are unusually light. */
							art->weight -= randint1(art->weight / 10) * 5 + 5;
							potential -= (kind->weight - art->weight) * 10;
						}
					}

					/* Sometimes spend everything to enhance the damage dice.
					 * SJGU assuming there wasn't too much to start with... */
					if (one_in_(3) && (initial_potential <= 4000)) {

						/* Probably sacrifice the Skill bonus. */
						if (!one_in_(3)) {
							art->to_h = 0;
							potential += 600;
							/* Possibly also sacrifice the Deadliness bonus. */
							if (one_in_(4)) {
								art->to_h = 0;
								potential += 600;
							}
						}
						get_property(art, obj, "enhanced dice", 1, true);
						/* We're done */
						break;
					}
				}
			} else if (randint1(art->dd * art->ds) < 5 || potential >= 2100) {
				/* Other weapons have enhanced damage dice in addition to other
				 * qualities.
				 * SJGU increased chance of this as small dice are useless */
				get_property(art, obj, "enhanced dice", 3, true);
			}

			/* Collect a slay or brand. */
			choice = randint1(13);
			if ((choice == 1) && !has_property(art, obj, "slay animals")) {
				get_property(art, obj, "slay animals", 17, true);
			}
			if ((choice == 2) && !has_property(art, obj,
											   "slay evil creatures")) {
				get_property(art, obj, "slay evil creatures", 15, true);
			}
			if ((choice == 3) && !has_property(art, obj, "slay undead")) {
				get_property(art, obj, "slay undead", 20, true);
			}
			if ((choice == 4) && !has_property(art, obj, "slay demons")) {
				get_property(art, obj, "slay demons", 20, true);
			}
			if ((choice == 5) && !has_property(art, obj, "slay orcs")) {
				get_property(art, obj, "slay orcs", 20, true);
			}
			if ((choice == 6) && !has_property(art, obj, "slay trolls")) {
				get_property(art, obj, "slay trolls", 20, true);
			}
			if ((choice == 7) && !has_property(art, obj, "slay giants")) {
				get_property(art, obj, "slay giants", 20, true);
			}
			if ((choice == 8) && !has_property(art, obj, "slay dragons")) {
				get_property(art, obj, "slay dragons", 20, true);
			}
			if ((choice == 9) && !has_property(art, obj, "acid brand")) {
				get_property(art, obj, "acid brand", 17, true);
			}
			if ((choice == 10) && !has_property(art, obj, "lightning brand")) {
				get_property(art, obj, "lightning brand", 17, true);
			}
			if ((choice == 11) && !has_property(art, obj, "fire brand")) {
				get_property(art, obj, "fire brand", 17, true);
			}
			if ((choice == 12) && !has_property(art, obj, "cold brand")) {
				get_property(art, obj, "cold brand", 17, true);
			}
			if ((choice == 13) && !has_property(art, obj, "poison brand")) {
				get_property(art, obj, "poison brand", 17, true);
			}
			/* Often, collect a miscellaneous quality, if it is affordable. */
			if (one_in_(2)) {
				choice = randint1(8);
				if ((choice == 1) && !has_property(art, obj, "slow digestion")){
					get_property(art, obj, "slow digestion", 0, false);
				}
				if ((choice == 2) &&
					!has_property(art, obj, "feather falling")) {
					get_property(art, obj, "feather falling", 0, false);
				}
				if ((choice == 3) && !has_property(art, obj, "light")) {
					get_property(art, obj, "light", 1, false);
				}
				if ((choice == 4) && !has_property(art, obj, "regeneration")) {
					get_property(art, obj, "regeneration", 0, false);
				}
				if ((choice == 5) && !has_property(art, obj, "see invisible")) {
					get_property(art, obj, "see invisible", 0, false);
				}
				if ((choice == 6) && !has_property(art, obj, "free action")) {
					get_property(art, obj, "free action", 0, false);
				}
				if ((choice == 7) &&
					!has_property(art, obj, "protection from fear")) {
					get_property(art, obj, "protection from fear", 0, false);
				}
				if ((choice == 8) &&
					!has_property(art, obj, "protection from blindness")) {
					get_property(art, obj, "protection from blindness", 0,
								 false);
				}
			}

			/* Sometimes, collect a resistance, if it is affordable. */
			if (one_in_(3)) {
				choice = randint1(11);
				if ((choice == 1) &&
					!has_property(art, obj, "acid resistance")) {
					get_property(art, obj, "acid resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 2) &&
					!has_property(art, obj, "electricity resistance")){
					get_property(art, obj, "electricity resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 3) &&
					!has_property(art, obj, "fire resistance")) {
					get_property(art, obj, "fire resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 4) &&
					!has_property(art, obj, "cold resistance")) {
					get_property(art, obj, "cold resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 5) &&
					!has_property(art, obj, "poison resistance")) {
					get_property(art, obj, "poison resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 6) &&
					!has_property(art, obj, "light resistance")) {
					get_property(art, obj, "light resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 7) &&
					!has_property(art, obj, "dark resistance")) {
					get_property(art, obj, "dark resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 8) &&
					!has_property(art, obj, "sound resistance")) {
					get_property(art, obj, "sound resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 9) &&
					!has_property(art, obj, "shards resistance")) {
					get_property(art, obj, "shards resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 10) &&
					!has_property(art, obj, "nexus resistance")) {
					get_property(art, obj, "nexus resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 11) &&
					!has_property(art, obj, "disenchantment resistance")) {
					get_property(art, obj, "disenchantment resistance",
								 35 + 5 * randint0(5), true);
				}
			}

			/* Clean out the wallet. */
			if ((potential < 500) && one_in_(5)) {
				if (has_property(art, obj, "deadliness bonus")) {
					get_property(art, obj, "deadliness bonus",
								 potential / 150, true);
				}
				if (has_property(art, obj, "skill bonus")) {
					get_property(art, obj, "skill bonus",
								 potential / 150, true);
				}
				potential = 0;
			}
		}

		/* I'm a missile weapon. */
		if (launcher) {
			/* Collect a miscellaneous quality. */
			choice = randint1(8);
			if ((choice == 1) && !has_property(art, obj, "slow digestion")){
				get_property(art, obj, "slow digestion", 0, false);
			}
			if ((choice == 2) &&
				!has_property(art, obj, "feather falling")) {
				get_property(art, obj, "feather falling", 0, false);
			}
			if ((choice == 3) && !has_property(art, obj, "light")) {
				get_property(art, obj, "light", 1, false);
			}
			if ((choice == 4) && !has_property(art, obj, "regeneration")) {
				get_property(art, obj, "regeneration", 0, false);
			}
			if ((choice == 5) && !has_property(art, obj, "see invisible")) {
				get_property(art, obj, "see invisible", 0, false);
			}
			if ((choice == 6) && !has_property(art, obj, "free action")) {
				get_property(art, obj, "free action", 0, false);
			}
			if ((choice == 7) &&
				!has_property(art, obj, "protection from fear")) {
				get_property(art, obj, "protection from fear", 0, false);
			}
			if ((choice == 8) &&
				!has_property(art, obj, "protection from blindness")) {
				get_property(art, obj, "protection from blindness", 0, false);
			}
			/* Sometimes, collect a resistance, if it is affordable. */
			if (one_in_(2)) {
				choice = randint1(11);
				if ((choice == 1) &&
					!has_property(art, obj, "acid resistance")) {
					get_property(art, obj, "acid resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 2) &&
					!has_property(art, obj, "electricity resistance")){
					get_property(art, obj, "electricity resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 3) &&
					!has_property(art, obj, "fire resistance")) {
					get_property(art, obj, "fire resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 4) &&
					!has_property(art, obj, "cold resistance")) {
					get_property(art, obj, "cold resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 5) &&
					!has_property(art, obj, "poison resistance")) {
					get_property(art, obj, "poison resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 6) &&
					!has_property(art, obj, "light resistance")) {
					get_property(art, obj, "light resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 7) &&
					!has_property(art, obj, "dark resistance")) {
					get_property(art, obj, "dark resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 8) &&
					!has_property(art, obj, "sound resistance")) {
					get_property(art, obj, "sound resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 9) &&
					!has_property(art, obj, "shards resistance")) {
					get_property(art, obj, "shards resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 10) &&
					!has_property(art, obj, "nexus resistance")) {
					get_property(art, obj, "nexus resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 11) &&
					!has_property(art, obj, "disenchantment resistance")) {
					get_property(art, obj, "disenchantment resistance",
								 35 + 5 * randint0(5), true);
				}
			}

			/* Clean out the wallet. */
			if ((potential < 500) && one_in_(5)) {
				if (has_property(art, obj, "deadliness bonus")) {
					get_property(art, obj, "deadliness bonus",
								 potential / 150, true);
				}
				if (has_property(art, obj, "skill bonus")) {
					get_property(art, obj, "skill bonus",
								 potential / 150, true);
				}
				potential = 0;
			}
		}

		/* I'm any piece of armour or jewellery. */

		/* Collect a resistance. */
		choice = randint1(11);
		if ((choice == 1) && !has_property(art, obj, "acid resistance")) {
			get_property(art, obj, "acid resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 2) && !has_property(art, obj, "electricity resistance")){
			get_property(art, obj, "electricity resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 3) && !has_property(art, obj, "fire resistance")) {
			get_property(art, obj, "fire resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 4) && !has_property(art, obj, "cold resistance")) {
			get_property(art, obj, "cold resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 5) && !has_property(art, obj, "poison resistance")) {
			get_property(art, obj, "poison resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 6) && !has_property(art, obj, "light resistance")) {
			get_property(art, obj, "light resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 7) && !has_property(art, obj, "dark resistance")) {
			get_property(art, obj, "dark resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 8) && !has_property(art, obj, "sound resistance")) {
			get_property(art, obj, "sound resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 9) && !has_property(art, obj, "shards resistance")) {
			get_property(art, obj, "shards resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 10) && !has_property(art, obj, "nexus resistance")) {
			get_property(art, obj, "nexus resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 11) &&
			!has_property(art, obj, "disenchantment resistance")) {
			get_property(art, obj, "disenchantment resistance",
						 35 + 5 * randint0(5), true);
		}
		/* Sometimes, collect a miscellaneous quality, if it is affordable. */
		if (one_in_(3)) {
			choice = randint1(8);
			if ((choice == 1) && !has_property(art, obj, "slow digestion")){
				get_property(art, obj, "slow digestion", 0, false);
			}
			if ((choice == 2) &&
				!has_property(art, obj, "feather falling")) {
				get_property(art, obj, "feather falling", 0, false);
			}
			if ((choice == 3) && !has_property(art, obj, "light")) {
				get_property(art, obj, "light", 1, false);
			}
			if ((choice == 4) && !has_property(art, obj, "regeneration")) {
				get_property(art, obj, "regeneration", 0, false);
			}
			if ((choice == 5) && !has_property(art, obj, "see invisible")) {
				get_property(art, obj, "see invisible", 0, false);
			}
			if ((choice == 6) && !has_property(art, obj, "free action")) {
				get_property(art, obj, "free action", 0, false);
			}
			if ((choice == 7) &&
				!has_property(art, obj, "protection from fear")) {
				get_property(art, obj, "protection from fear", 0, false);
			}
			if ((choice == 8) &&
				!has_property(art, obj, "protection from blindness")) {
				get_property(art, obj, "protection from blindness", 0, false);
			}

			/* Clean out the wallet. */
			if ((potential < 500) && one_in_(5)) {
				if (has_property(art, obj, "armor bonus")) {
					get_property(art, obj, "armor bonus", potential/ 100, true);
					potential = 0;
				}
			}
		}
	}

	/* On sale free! Last chance! */

	/* If an artifact affects a stat, it may also possibly sustain it. */
	choice = randint0(STAT_MAX);
	for (i = 0; i < STAT_MAX; i++) {
		const char *stat = lookup_obj_property(OBJ_PROPERTY_STAT, i)->name;
		const char *sust = lookup_obj_property(OBJ_PROPERTY_FLAG, i + 1)->name;
		if ((choice == i) && has_property(art, obj, stat)) {
			get_property(art, obj, sust, 0, true);
		}
	}

	/* Armour gets a basic resist or low-level ability with 50% probability,
	 * and weapons with 25% probability. */
	if ((weapon && one_in_(4)) || one_in_(2)) {
		int16_t *res;
		choice = randint0(6);
		res = art ? &(art->el_info[choice].res_level) :
			&(obj->el_info[choice].res_level);
		if (choice < 4) {
			*res = ((*res) * 2) / 3;
		} else if (choice == 4) {
			get_property(art, obj, "slow digestion", 0, true);
		} else if (choice == 5) {
			get_property(art, obj, "feather falling", 0, true);
		}
	}

	/* Frequently neaten bonuses to Armour Class, Skill, and Deadliness. */
	for (i = 0; i < 3; i++) {
		int16_t *bonus_chg = art ? &art->to_a : &obj->to_a;
		if (i == 1) { 
			bonus_chg = art ? &art->to_h : &obj->to_h;
		}
		if (i == 2) { 
			bonus_chg = art ? &art->to_d : &obj->to_d;
		}
		if (((*bonus_chg) % 5 == 4) && one_in_(2)) {
			(*bonus_chg)++;
		} else if (((*bonus_chg) % 5 == 1) && one_in_(2)) {
			(*bonus_chg)--;
		} else if (((*bonus_chg) % 2 == 1) && !one_in_(4)) {
			(*bonus_chg)++;
		}
	}
}